

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

uintb JumpBasic::backup2Switch(Funcdata *fd,uintb output,Varnode *outvn,Varnode *invn)

{
  PcodeOp *pPVar1;
  Varnode *pVVar2;
  AddrSpace *spc;
  int iVar3;
  uintb uVar4;
  undefined4 extraout_var;
  pointer ppVVar5;
  undefined4 extraout_var_00;
  LowlevelError *this;
  uint uVar6;
  long lVar7;
  long lVar8;
  TypeOp *pTVar9;
  uint uVar10;
  allocator local_69;
  Funcdata *local_68;
  TypeOp *local_60;
  uintb local_58;
  MemoryImage mem;
  
  local_68 = fd;
  do {
    if (outvn == invn) {
      return output;
    }
    pPVar1 = outvn->def;
    pTVar9 = pPVar1->opcode;
    ppVVar5 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar6 = (uint)((ulong)((long)(pPVar1->inrefs).
                                 super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)ppVVar5) >> 3);
    uVar10 = 0;
    if (0 < (int)uVar6) {
      uVar10 = uVar6;
    }
    lVar7 = (long)(int)uVar6;
    if ((long)(int)uVar6 < 1) {
      lVar7 = 0;
    }
    for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
      if ((ppVVar5[lVar8]->flags & 2) == 0) {
        uVar10 = (uint)lVar8;
        break;
      }
    }
    uVar6 = pPVar1->flags & 0x38000;
    if (uVar6 == 0x8000) {
      iVar3 = (*pTVar9->behave->_vptr_OpBehavior[5])
                        (pTVar9->behave,(ulong)(uint)pPVar1->output->size,output,
                         (ulong)(uint)ppVVar5[uVar10]->size);
      output = CONCAT44(extraout_var,iVar3);
    }
    else {
      if (uVar6 != 0x10000) {
        this = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&mem,"Bad switch normalization op",&local_69);
        LowlevelError::LowlevelError(this,(string *)&mem);
        __cxa_throw(this,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      pVVar2 = ppVVar5[(int)(1 - uVar10)];
      spc = (pVVar2->loc).base;
      if (spc->type == IPTR_CONSTANT) {
        uVar4 = (pVVar2->loc).offset;
      }
      else {
        local_60 = pTVar9;
        local_58 = output;
        MemoryImage::MemoryImage(&mem,spc,4,0x400,local_68->glb->loader);
        uVar4 = MemoryBank::getValue
                          (&mem.super_MemoryBank,(pVVar2->loc).offset,
                           (pPVar1->inrefs).
                           super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)(1 - uVar10)]->size);
        ppVVar5 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pTVar9 = local_60;
        output = local_58;
      }
      iVar3 = (*pTVar9->behave->_vptr_OpBehavior[4])
                        (pTVar9->behave,(ulong)uVar10,(ulong)(uint)pPVar1->output->size,output,
                         (ulong)(uint)ppVVar5[uVar10]->size,uVar4);
      output = CONCAT44(extraout_var_00,iVar3);
    }
    outvn = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10];
  } while( true );
}

Assistant:

uintb JumpBasic::backup2Switch(Funcdata *fd,uintb output,Varnode *outvn,Varnode *invn)

{ // Back up constant normalized value -outvn- to unnormalized
  Varnode *curvn = outvn;
  PcodeOp *op;
  TypeOp *top;
  int4 slot;

  while(curvn != invn) {
    op = curvn->getDef();
    top = op->getOpcode();
    for(slot=0;slot<op->numInput();++slot) // Find first non-constant input
      if (!op->getIn(slot)->isConstant()) break;
    if (op->getEvalType() == PcodeOp::binary) {
      const Address &addr(op->getIn(1-slot)->getAddr());
      uintb otherval;
      if (!addr.isConstant()) {
	MemoryImage mem(addr.getSpace(),4,1024,fd->getArch()->loader);
	otherval = mem.getValue(addr.getOffset(),op->getIn(1-slot)->getSize());
      }
      else
	otherval = addr.getOffset();
      output = top->recoverInputBinary(slot,op->getOut()->getSize(),output,
				       op->getIn(slot)->getSize(),otherval);
      curvn = op->getIn(slot);
    }
    else if (op->getEvalType() == PcodeOp::unary) {
      output = top->recoverInputUnary(op->getOut()->getSize(),output,op->getIn(slot)->getSize());
      curvn = op->getIn(slot);
    }
    else
      throw LowlevelError("Bad switch normalization op");
  }
  return output;
}